

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall
(anonymous_namespace)::FileSetType::WriteProperties<std::__cxx11::string>
          (FileSetType *this,cmTarget *tgt,cmTargetInternals *impl,string *prop,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,bool clear)

{
  cmMakefile *pcVar1;
  string_view description;
  string_view description_00;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  cmAlphaNum *this_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  string_view sVar4;
  string_view str;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_02;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileSetName;
  cmAlphaNum local_130;
  size_t local_100;
  char *pcStack_f8;
  size_t local_f0;
  char *pcStack_e8;
  cmAlphaNum local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __x._M_str = (prop->_M_dataplus)._M_p;
  __x._M_len = prop->_M_string_length;
  bVar2 = std::operator==(__x,*(basic_string_view<char,_std::char_traits<char>_> *)(this + 0x10));
  if (bVar2) {
    std::__cxx11::string::string<cm::static_string_view,void>
              ((string *)&local_130,(static_string_view *)this,(allocator<char> *)&local_e0);
    std::__cxx11::string::string((string *)&local_50,(string *)value);
    cmTargetInternals::AddDirectoryToFileSet<std::__cxx11::string>
              (impl,tgt,(string *)&local_130,&local_50,*(string_view *)this,
               *(string_view *)(this + 0x60),false);
    pbVar3 = &local_50;
  }
  else {
    __x_00._M_str = (prop->_M_dataplus)._M_p;
    __x_00._M_len = prop->_M_string_length;
    bVar2 = std::operator==(__x_00,*(basic_string_view<char,_std::char_traits<char>_> *)
                                    (this + 0x20));
    if (!bVar2) {
      sVar4._M_str = (prop->_M_dataplus)._M_p;
      sVar4._M_len = prop->_M_string_length;
      bVar2 = cmHasPrefix(sVar4,*(string_view *)(this + 0x30));
      if (bVar2) {
        std::__cxx11::string::substr((ulong)&fileSetName,(ulong)prop);
        if (fileSetName._M_string_length == 0) {
          pcVar1 = impl->Makefile;
          local_130.View_._M_len = *(size_t *)(this + 0x70);
          local_130.View_._M_str = *(char **)(this + 0x78);
          local_e0.View_._M_len = 0x16;
          local_e0.View_._M_str = " name cannot be empty.";
          cmStrCat<>(&local_170,&local_130,&local_e0);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_170);
LAB_00289f28:
          pbVar3 = &local_170;
        }
        else {
          std::__cxx11::string::string((string *)&local_90,(string *)value);
          sVar4 = *(string_view *)this;
          local_130.View_._M_len = *(size_t *)(this + 0x70);
          local_130.View_._M_str = *(char **)(this + 0x78);
          local_e0.View_._M_len = 2;
          local_e0.View_._M_str = " \"";
          cmStrCat<std::__cxx11::string,char[2]>
                    (&local_170,&local_130,&local_e0,&fileSetName,(char (*) [2])0x64a9dc);
          local_f0 = local_170._M_string_length;
          pcStack_e8 = local_170._M_dataplus._M_p;
          description._M_str = local_170._M_dataplus._M_p;
          description._M_len = local_170._M_string_length;
          cmTargetInternals::AddDirectoryToFileSet<std::__cxx11::string>
                    (impl,tgt,&fileSetName,&local_90,sVar4,description,false);
          std::__cxx11::string::~string((string *)&local_170);
          pbVar3 = &local_90;
        }
LAB_00289f2d:
        std::__cxx11::string::~string((string *)pbVar3);
      }
      else {
        str._M_str = (prop->_M_dataplus)._M_p;
        str._M_len = prop->_M_string_length;
        bVar2 = cmHasPrefix(str,*(string_view *)(this + 0x40));
        if (bVar2) {
          std::__cxx11::string::substr((ulong)&fileSetName,(ulong)prop);
          if (fileSetName._M_string_length == 0) {
            pcVar1 = impl->Makefile;
            local_130.View_._M_len = *(size_t *)(this + 0x70);
            local_130.View_._M_str = *(char **)(this + 0x78);
            local_e0.View_._M_len = 0x16;
            local_e0.View_._M_str = " name cannot be empty.";
            cmStrCat<>(&local_170,&local_130,&local_e0);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_170);
            goto LAB_00289f28;
          }
          std::__cxx11::string::string((string *)&local_b0,(string *)value);
          sVar4 = *(string_view *)this;
          local_130.View_._M_len = *(size_t *)(this + 0x70);
          local_130.View_._M_str = *(char **)(this + 0x78);
          local_e0.View_._M_len = 2;
          local_e0.View_._M_str = " \"";
          cmStrCat<std::__cxx11::string,char[2]>
                    (&local_170,&local_130,&local_e0,&fileSetName,(char (*) [2])0x64a9dc);
          local_100 = local_170._M_string_length;
          pcStack_f8 = local_170._M_dataplus._M_p;
          description_00._M_str = local_170._M_dataplus._M_p;
          description_00._M_len = local_170._M_string_length;
          cmTargetInternals::AddPathToFileSet<std::__cxx11::string>
                    (impl,tgt,&fileSetName,&local_b0,sVar4,description_00,false);
          std::__cxx11::string::~string((string *)&local_170);
          pbVar3 = &local_b0;
          goto LAB_00289f2d;
        }
        __x_01._M_str = (prop->_M_dataplus)._M_p;
        __x_01._M_len = prop->_M_string_length;
        bVar2 = std::operator==(__x_01,*(basic_string_view<char,_std::char_traits<char>_> *)
                                        (this + 0x80));
        if (bVar2) {
          pcVar1 = impl->Makefile;
          local_130.View_._M_len = *(size_t *)(this + 0x80);
          local_130.View_._M_str = *(char **)(this + 0x88);
          local_e0.View_._M_len = 0x17;
          local_e0.View_._M_str = " property is read-only\n";
          cmStrCat<>(&fileSetName,&local_130,&local_e0);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&fileSetName);
        }
        else {
          __x_02._M_str = (prop->_M_dataplus)._M_p;
          __x_02._M_len = prop->_M_string_length;
          bVar2 = std::operator==(__x_02,*(basic_string_view<char,_std::char_traits<char>_> *)
                                          (this + 0xa8));
          if (!bVar2) {
            return false;
          }
          pcVar1 = impl->Makefile;
          local_130.View_._M_len = *(size_t *)(this + 0xa8);
          local_130.View_._M_str = *(char **)(this + 0xb0);
          local_e0.View_._M_len = 0x17;
          local_e0.View_._M_str = " property is read-only\n";
          cmStrCat<>(&fileSetName,&local_130,&local_e0);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&fileSetName);
        }
      }
      this_00 = (cmAlphaNum *)&fileSetName;
      goto LAB_00289f37;
    }
    std::__cxx11::string::string<cm::static_string_view,void>
              ((string *)&local_130,(static_string_view *)this,(allocator<char> *)&local_e0);
    std::__cxx11::string::string((string *)&local_70,(string *)value);
    cmTargetInternals::AddPathToFileSet<std::__cxx11::string>
              (impl,tgt,(string *)&local_130,&local_70,*(string_view *)this,
               *(string_view *)(this + 0x60),false);
    pbVar3 = &local_70;
  }
  std::__cxx11::string::~string((string *)pbVar3);
  this_00 = &local_130;
LAB_00289f37:
  std::__cxx11::string::~string((string *)this_00);
  return true;
}

Assistant:

bool FileSetType::WriteProperties(cmTarget* tgt, cmTargetInternals* impl,
                                  const std::string& prop, ValueType value,
                                  bool clear)
{
  if (prop == this->DefaultDirectoryProperty) {
    impl->AddDirectoryToFileSet(tgt, std::string(this->TypeName), value,
                                this->TypeName, this->DefaultDescription,
                                clear);
    return true;
  }
  if (prop == this->DefaultPathProperty) {
    impl->AddPathToFileSet(tgt, std::string(this->TypeName), value,
                           this->TypeName, this->DefaultDescription, clear);
    return true;
  }
  if (cmHasPrefix(prop, this->DirectoryPrefix)) {
    auto fileSetName = prop.substr(this->DirectoryPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddDirectoryToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""), clear);
    }
    return true;
  }
  if (cmHasPrefix(prop, this->PathPrefix)) {
    auto fileSetName = prop.substr(this->PathPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddPathToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""), clear);
    }
    return true;
  }
  if (prop == this->SelfEntries.PropertyName) {
    impl->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(this->SelfEntries.PropertyName, " property is read-only\n"));
    return true;
  }
  if (prop == this->InterfaceEntries.PropertyName) {
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat(this->InterfaceEntries.PropertyName,
                                          " property is read-only\n"));
    return true;
  }
  return false;
}